

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O2

void __thiscall
Assimp::IFC::Schema_2x3::IfcReinforcingBar::IfcReinforcingBar(IfcReinforcingBar *this)

{
  *(undefined ***)&this->field_0x208 = &PTR__Object_007331c0;
  *(undefined8 *)&this->field_0x210 = 0;
  *(char **)&this->field_0x218 = "IfcReinforcingBar";
  Schema_2x3::IfcReinforcingElement::IfcReinforcingElement
            (&this->super_IfcReinforcingElement,&PTR_construction_vtable_24__0076d5f8);
  *(undefined8 *)&(this->super_IfcReinforcingElement).field_0x198 = 0;
  *(undefined8 *)
   &(this->super_IfcReinforcingElement).super_IfcBuildingElementComponent.super_IfcBuildingElement.
    super_IfcElement.super_IfcProduct.super_IfcObject = 0x76d478;
  *(undefined8 *)&this->field_0x208 = 0x76d5e0;
  *(undefined8 *)
   &(this->super_IfcReinforcingElement).super_IfcBuildingElementComponent.super_IfcBuildingElement.
    super_IfcElement.super_IfcProduct.super_IfcObject.field_0x88 = 0x76d4a0;
  (this->super_IfcReinforcingElement).super_IfcBuildingElementComponent.super_IfcBuildingElement.
  super_IfcElement.super_IfcProduct.super_IfcObject.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcObject,_1UL>._vptr_ObjectHelper =
       (_func_int **)0x76d4c8;
  *(undefined8 *)
   &(this->super_IfcReinforcingElement).super_IfcBuildingElementComponent.super_IfcBuildingElement.
    super_IfcElement.super_IfcProduct.super_IfcObject.field_0xd0 = 0x76d4f0;
  *(undefined8 *)
   &(this->super_IfcReinforcingElement).super_IfcBuildingElementComponent.super_IfcBuildingElement.
    super_IfcElement.super_IfcProduct.field_0x100 = 0x76d518;
  *(undefined8 *)
   &(this->super_IfcReinforcingElement).super_IfcBuildingElementComponent.super_IfcBuildingElement.
    super_IfcElement.field_0x138 = 0x76d540;
  *(undefined8 *)
   &(this->super_IfcReinforcingElement).super_IfcBuildingElementComponent.super_IfcBuildingElement.
    super_IfcElement.field_0x148 = 0x76d568;
  *(undefined8 *)
   &(this->super_IfcReinforcingElement).super_IfcBuildingElementComponent.super_IfcBuildingElement.
    field_0x158 = 0x76d590;
  *(undefined8 *)&(this->super_IfcReinforcingElement).field_0x190 = 0x76d5b8;
  (this->BarLength).have = false;
  (this->BarRole)._M_dataplus._M_p = (pointer)&(this->BarRole).field_2;
  (this->BarRole)._M_string_length = 0;
  (this->BarRole).field_2._M_local_buf[0] = '\0';
  (this->BarSurface).ptr._M_dataplus._M_p = (pointer)&(this->BarSurface).ptr.field_2;
  (this->BarSurface).ptr._M_string_length = 0;
  (this->BarSurface).ptr.field_2._M_local_buf[0] = '\0';
  (this->BarSurface).have = false;
  return;
}

Assistant:

IfcReinforcingBar() : Object("IfcReinforcingBar") {}